

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O0

void __thiscall
google::protobuf::io::Printer::PrintImpl
          (Printer *this,string_view format,
          Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          args,PrintOptions opts)

{
  char cVar1;
  AnnotationCollector *pAVar2;
  PrintOptions PVar3;
  PrintOptions opts_00;
  string_view data;
  string_view v;
  PrintOptions opts_01;
  string_view data_00;
  string_view data_01;
  PrintOptions opts_02;
  string_view var_00;
  PrintOptions opts_03;
  PrintOptions opts_04;
  string_view var_01;
  PrintOptions opts_05;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view data_02;
  PrintOptions opts_06;
  string_view message;
  string_view str_00;
  PrintOptions opts_07;
  PrintOptions opts_08;
  PrintOptions opts_09;
  string_view data_03;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  undefined8 uVar5;
  value_type *pvVar6;
  size_type sVar7;
  bool bVar8;
  bool bVar9;
  value_type *pvVar10;
  reference this_00;
  size_type sVar11;
  const_reference pvVar12;
  reference pvVar13;
  size_type sVar14;
  ulong uVar15;
  reference pvVar16;
  size_t sVar17;
  AnnotationRecord *pAVar18;
  AnnotationRecord *pAVar19;
  AnnotationRecord *pAVar20;
  uchar *puVar21;
  const_reference pvVar22;
  reference pbVar23;
  ValueImpl<false> *pVVar24;
  string_view *psVar25;
  LogMessage *pLVar26;
  char *pcVar27;
  reference pcVar28;
  pointer prVar29;
  char *pcVar30;
  string *psVar31;
  char *pcVar32;
  char *extraout_RDX;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> in_R9;
  string_view sVar33;
  basic_string_view<char,_std::char_traits<char>_> bVar34;
  pair<unsigned_long,_unsigned_long> pVar35;
  string_view str_01;
  anon_class_16_2_b8dd3087 callback;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  string_view var_02;
  string_view expected_04;
  Span<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  frames;
  bool local_ae9;
  byte local_98b;
  byte local_98a;
  byte local_989;
  string_view local_970;
  PrintOptions local_960;
  anon_class_24_2_8517b00c local_950;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_938;
  PrintOptions local_928;
  PrintOptions local_918;
  anon_class_16_1_3a1eaf4f local_908;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_8f0;
  PrintOptions local_8e0;
  int local_8d0 [2];
  pair<unsigned_long,_unsigned_long> local_8c8;
  pair<unsigned_long,_unsigned_long> local_8b8;
  undefined1 local_8a8 [8];
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>::iterator,_bool>
  insertion;
  basic_string_view<char,_std::char_traits<char>_> local_878;
  char local_861;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_860;
  char c;
  iterator __end5;
  iterator __begin5;
  string *__range5;
  string_view text_1;
  size_t next_idx;
  _anonymous_namespace_ *local_828;
  size_t sStack_820;
  byte local_811;
  LogMessage local_810;
  Voidify local_7f9;
  PrintOptions local_7f8;
  string_view local_7e8;
  PrintOptions local_7d8;
  byte local_7c9;
  LogMessage local_7c8;
  Voidify local_7b1;
  Callback *local_7b0;
  Callback *fnc;
  size_t sStack_7a0;
  size_t local_798;
  char *pcStack_790;
  char *local_788;
  size_t sStack_780;
  StringType *local_770;
  string_view *str;
  size_t range_end;
  size_t range_start;
  undefined1 local_750;
  anon_class_16_1_ba1d8287 local_748;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_738;
  size_t local_728;
  bool local_720;
  Span<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_718;
  _anonymous_namespace_ *local_708;
  char *pcStack_700;
  optional<google::protobuf::io::Printer::AnnotationRecord> local_6f0;
  Span<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_6a8;
  _anonymous_namespace_ *local_698;
  size_t sStack_690;
  optional<google::protobuf::io::Printer::ValueImpl<false>_> local_688;
  PrintOptions local_630;
  PrintOptions local_620;
  size_t local_610;
  size_t idx_1;
  undefined1 local_600;
  string_view local_5f8;
  size_t local_5e8;
  bool local_5e0;
  undefined1 local_5d8 [8];
  optional<google::protobuf::io::Printer::AnnotationRecord> same_name_record;
  optional<google::protobuf::io::Printer::ValueImpl<false>_> sub;
  anon_class_16_1_ba1d8287 local_518;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_508;
  PrintOptions local_4f8;
  Span<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_4e8;
  _anonymous_namespace_ *local_4d8;
  char *pcStack_4d0;
  undefined1 local_4c0 [8];
  optional<google::protobuf::io::Printer::AnnotationRecord> record;
  anon_class_40_2_1c5b79f8 local_468;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_438;
  PrintOptions local_428;
  _anonymous_namespace_ *local_418;
  size_t sStack_410;
  size_t local_408;
  size_t sStack_400;
  size_t sStack_3f8;
  value_type record_var;
  basic_string_view<char,_std::char_traits<char>_> local_3c8;
  char *pcStack_3b8;
  string_view text;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long> local_3a0;
  basic_string_view<char,_std::char_traits<char>_> local_388;
  undefined1 local_371;
  undefined1 auStack_370 [7];
  bool is_end;
  char *local_368;
  byte local_359;
  optional<google::protobuf::io::Printer::SourceLocation> oStack_358;
  bool bStack_356;
  bool bStack_355;
  bool bStack_354;
  bool bStack_353;
  bool bStack_352;
  bool is_start;
  undefined1 local_350;
  basic_string_view<char,_std::char_traits<char>_> local_348;
  PrintOptions local_338;
  basic_string_view<char,_std::char_traits<char>_> local_328;
  size_t local_318;
  size_t sStack_310;
  string_view local_308;
  basic_string_view<char,_std::char_traits<char>_> local_2f8;
  lts_20250127 *local_2e8;
  size_t sStack_2e0;
  string_view local_2d8;
  undefined1 auStack_2c8 [8];
  string_view suffix;
  string_view prefix;
  string_view local_298;
  PrintOptions local_288;
  basic_string_view<char,_std::char_traits<char>_> local_278;
  int local_264;
  size_t local_260;
  pair<unsigned_long,_unsigned_long> local_258;
  pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  PrintOptions local_218;
  PrintOptions local_208;
  size_t local_1f8;
  size_t idx;
  undefined1 local_1e8;
  string_view local_1e0;
  size_t local_1d0;
  bool local_1c8;
  PrintOptions local_1c0;
  string_view local_1b0;
  PrintOptions local_1a0;
  basic_string_view<char,_std::char_traits<char>_> local_190;
  SourceLocation local_17a [2];
  _anonymous_namespace_ *local_178;
  size_t sStack_170;
  undefined1 auStack_168 [8];
  string_view var;
  undefined1 auStack_148 [8];
  value_type chunk;
  size_t chunk_idx;
  byte local_112;
  undefined1 local_111;
  bool should_skip_newline;
  reference pvStack_110;
  bool prev_was_empty;
  value_type *line;
  size_t line_idx;
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
  annot_records;
  vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  annot_stack;
  size_t sStack_c8;
  bool skip_next_newline;
  size_t arg_index;
  undefined1 local_a0 [8];
  Format fmt;
  string_view original;
  undefined1 local_50 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_cc:520:25)>
  unindent;
  size_t original_indent;
  Printer *this_local;
  Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  args_local;
  string_view format_local;
  
  args_local.ptr_ = (pointer)args.len_;
  this_local = (Printer *)args.ptr_;
  pcVar32 = format._M_str;
  args_local.len_ = format._M_len;
  unindent.storage_.callback_buffer_._8_8_ = this->indent_;
  callback.original_indent = unindent.storage_.callback_buffer_._8_8_;
  callback.this = (Printer *)unindent.storage_.callback_buffer_._8_8_;
  absl::lts_20250127::
  MakeCleanup<,google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__0>
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_cc:520:25)>
              *)local_50,(lts_20250127 *)this,callback);
  sVar7 = args_local.len_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->line_start_variables_);
  if (((unkuint9)opts & 0x1000000) != 0) {
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::clear((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
             *)&this->substitutions_);
  }
  sVar33._M_str = pcVar32;
  sVar33._M_len = args_local.len_;
  TokenizeFormat((Format *)local_a0,this,sVar33,&opts);
  PrintCodegenTrace(this,opts.loc);
  sStack_c8 = 0;
  bVar9 = false;
  std::
  vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&annot_records.
               super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
  ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
            *)&line_idx);
  line = (value_type *)0x0;
  do {
    pvVar6 = line;
    pvVar10 = (value_type *)
              std::
              vector<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
              ::size((vector<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                      *)local_a0);
    if (pvVar10 <= pvVar6) {
      sVar11 = absl::lts_20250127::
               Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::size((Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&this_local);
      PVar3 = opts;
      local_8e0.use_annotation_frames = opts.use_annotation_frames;
      local_8e0.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
           opts.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
           _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
      local_8e0.checks_are_debug_only = opts.checks_are_debug_only;
      local_8e0.use_substitution_map = opts.use_substitution_map;
      local_8e0.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
      local_8e0.allow_digit_substitutions = opts.allow_digit_substitutions;
      local_8e0.strip_spaces_around_vars = opts.strip_spaces_around_vars;
      local_8e0.strip_raw_string_indentation = opts.strip_raw_string_indentation;
      local_908.original._M_len = sVar7;
      opts = PVar3;
      local_908.original._M_str = pcVar32;
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__4,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_8f0,&local_908);
      local_918.use_annotation_frames = local_8e0.use_annotation_frames;
      local_918.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
           local_8e0.loc.
           super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
           _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
      local_918.checks_are_debug_only = local_8e0.checks_are_debug_only;
      local_918.use_substitution_map = local_8e0.use_substitution_map;
      local_918.use_curly_brace_substitutions = local_8e0.use_curly_brace_substitutions;
      local_918.allow_digit_substitutions = local_8e0.allow_digit_substitutions;
      local_918.strip_spaces_around_vars = local_8e0.strip_spaces_around_vars;
      local_918.strip_raw_string_indentation = local_8e0.strip_raw_string_indentation;
      opts_00.use_annotation_frames = local_8e0.use_annotation_frames;
      opts_00.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
           local_8e0.loc.
           super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
           _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
      opts_00.checks_are_debug_only = local_8e0.checks_are_debug_only;
      opts_00.use_substitution_map = local_8e0.use_substitution_map;
      opts_00.use_curly_brace_substitutions = local_8e0.use_curly_brace_substitutions;
      opts_00.allow_digit_substitutions = local_8e0.allow_digit_substitutions;
      opts_00.strip_spaces_around_vars = local_8e0.strip_spaces_around_vars;
      opts_00.strip_raw_string_indentation = local_8e0.strip_raw_string_indentation;
      Validate(sStack_c8 == sVar11,opts_00,local_8f0);
      bVar9 = std::
              vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty((vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&annot_records.
                          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      PVar3 = opts;
      local_928.use_annotation_frames = opts.use_annotation_frames;
      local_928.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
           opts.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
           _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
      local_928.checks_are_debug_only = opts.checks_are_debug_only;
      local_928.use_substitution_map = opts.use_substitution_map;
      local_928.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
      local_928.allow_digit_substitutions = opts.allow_digit_substitutions;
      local_928.strip_spaces_around_vars = opts.strip_spaces_around_vars;
      local_928.strip_raw_string_indentation = opts.strip_raw_string_indentation;
      local_950.original._M_len = sVar7;
      opts = PVar3;
      local_950.this = this;
      local_950.original._M_str = pcVar32;
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__5,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_938,&local_950);
      local_960.use_annotation_frames = local_928.use_annotation_frames;
      local_960.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
           local_928.loc.
           super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
           _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
      local_960.checks_are_debug_only = local_928.checks_are_debug_only;
      local_960.use_substitution_map = local_928.use_substitution_map;
      local_960.use_curly_brace_substitutions = local_928.use_curly_brace_substitutions;
      local_960.allow_digit_substitutions = local_928.allow_digit_substitutions;
      local_960.strip_spaces_around_vars = local_928.strip_spaces_around_vars;
      local_960.strip_raw_string_indentation = local_928.strip_raw_string_indentation;
      PVar3.use_annotation_frames = local_928.use_annotation_frames;
      PVar3.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
           local_928.loc.
           super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
           _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
      PVar3.checks_are_debug_only = local_928.checks_are_debug_only;
      PVar3.use_substitution_map = local_928.use_substitution_map;
      PVar3.use_curly_brace_substitutions = local_928.use_curly_brace_substitutions;
      PVar3.allow_digit_substitutions = local_928.allow_digit_substitutions;
      PVar3.strip_spaces_around_vars = local_928.strip_spaces_around_vars;
      PVar3.strip_raw_string_indentation = local_928.strip_raw_string_indentation;
      Validate(bVar9,PVar3,local_938);
      if ((((byte)fmt.lines.
                  super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage & 1) != 0) &&
         ((this->at_start_of_line_ & 1U) == 0)) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_970,"\n");
        PrintRaw(this,local_970);
        this->at_start_of_line_ = true;
      }
      std::
      vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
      ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
                 *)&line_idx);
      std::
      vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&annot_records.
                    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Format::~Format((Format *)local_a0);
      absl::lts_20250127::
      Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.cc:520:25)>
      ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_cc:520:25)>
                  *)local_50);
      return;
    }
    pvStack_110 = std::
                  vector<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                  ::operator[]((vector<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                                *)local_a0,(size_type)line);
    if (line != (value_type *)0x0) {
      this_00 = std::
                vector<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                ::operator[]((vector<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                              *)local_a0,(size_type)((long)&line[-1].indent + 7));
      local_111 = std::
                  vector<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                  ::empty(&this_00->chunks);
      local_989 = 1;
      if (!bVar9) {
        local_98a = 0;
        if (((byte)fmt.lines.
                   super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage & 1) != 0) {
          local_98b = 0;
          if ((this->at_start_of_line_ & 1U) != 0) {
            local_98b = local_111 ^ 0xff;
          }
          local_98a = local_98b;
        }
        local_989 = local_98a;
      }
      local_112 = local_989 & 1;
      if (local_112 == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&this->line_start_variables_);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&chunk_idx,"\n");
        zc_sink_internal::ZeroCopyStreamByteSink::Write(&this->sink_,_chunk_idx);
        this->at_start_of_line_ = true;
      }
    }
    bVar9 = false;
    this->indent_ = unindent.storage_.callback_buffer_._8_8_ + pvStack_110->indent;
    chunk.is_var = false;
    chunk._17_7_ = 0;
    while( true ) {
      uVar5 = chunk._16_8_;
      sVar11 = std::
               vector<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
               ::size(&pvStack_110->chunks);
      if (sVar11 <= (ulong)uVar5) break;
      pvVar12 = std::
                vector<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                ::operator[](&pvStack_110->chunks,chunk._16_8_);
      auStack_148 = (undefined1  [8])(pvVar12->text)._M_len;
      pcVar30 = (pvVar12->text)._M_str;
      chunk.text._M_str = *(char **)&pvVar12->is_var;
      chunk.text._M_len = (size_t)pcVar30;
      if (((ulong)chunk.text._M_str & 1) == 0) {
        var._M_str = (char *)auStack_148;
        PrintRaw(this,pvVar12->text);
      }
      else {
        bVar8 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)auStack_148);
        if (bVar8) {
          WriteRaw(this,&(this->options_).variable_delimiter,1);
        }
        else {
          auStack_168 = auStack_148;
          var._M_len = chunk.text._M_len;
          bVar8 = absl::lts_20250127::operator!=(&this->substitution_listener_,(nullptr_t)0x0);
          if (bVar8) {
            local_178 = (_anonymous_namespace_ *)auStack_168;
            sStack_170 = var._M_len;
            std::optional<google::protobuf::io::Printer::SourceLocation>::
            value_or<google::protobuf::io::Printer::SourceLocation>(&opts.loc,local_17a);
            absl::lts_20250127::internal_any_invocable::
            Impl<void_(std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation)>
            ::operator()(&(this->substitution_listener_).
                          super_Impl<void_(std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation)>
                         ,local_178,sStack_170);
          }
          if (((unkuint9)opts & 0x100000000) != 0) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_190,"{")
            ;
            expected._M_str = pcVar30;
            expected._M_len = (size_t)local_190._M_str;
            bVar8 = absl::lts_20250127::ConsumePrefix
                              ((lts_20250127 *)auStack_168,
                               (Nonnull<absl::string_view_*>)local_190._M_len,expected);
            if (bVar8) {
              sVar11 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                 ((basic_string_view<char,_std::char_traits<char>_> *)auStack_168);
              PVar3 = opts;
              local_1a0.use_annotation_frames = opts.use_annotation_frames;
              local_1a0.loc.
              super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
              _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>
                   = opts.loc.
                     super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
              local_1a0.checks_are_debug_only = opts.checks_are_debug_only;
              local_1a0.use_substitution_map = opts.use_substitution_map;
              local_1a0.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
              local_1a0.allow_digit_substitutions = opts.allow_digit_substitutions;
              local_1a0.strip_spaces_around_vars = opts.strip_spaces_around_vars;
              local_1a0.strip_raw_string_indentation = opts.strip_raw_string_indentation;
              opts = PVar3;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_1b0,"expected single-digit variable");
              local_1c0.use_annotation_frames = local_1a0.use_annotation_frames;
              local_1c0.loc.
              super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
              _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>
                   = local_1a0.loc.
                     super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
              local_1c0.checks_are_debug_only = local_1a0.checks_are_debug_only;
              local_1c0.use_substitution_map = local_1a0.use_substitution_map;
              local_1c0.use_curly_brace_substitutions = local_1a0.use_curly_brace_substitutions;
              local_1c0.allow_digit_substitutions = local_1a0.allow_digit_substitutions;
              local_1c0.strip_spaces_around_vars = local_1a0.strip_spaces_around_vars;
              local_1c0.strip_raw_string_indentation = local_1a0.strip_raw_string_indentation;
              opts_09.use_annotation_frames = local_1a0.use_annotation_frames;
              opts_09.loc.
              super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
              _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>
                   = local_1a0.loc.
                     super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
              opts_09.checks_are_debug_only = local_1a0.checks_are_debug_only;
              opts_09.use_substitution_map = local_1a0.use_substitution_map;
              opts_09.use_curly_brace_substitutions = local_1a0.use_curly_brace_substitutions;
              opts_09.allow_digit_substitutions = local_1a0.allow_digit_substitutions;
              opts_09.strip_spaces_around_vars = local_1a0.strip_spaces_around_vars;
              opts_09.strip_raw_string_indentation = local_1a0.strip_raw_string_indentation;
              bVar8 = Validate(sVar11 == 1,opts_09,local_1b0);
              if (bVar8) {
                puVar21 = (uchar *)std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                             ((basic_string_view<char,_std::char_traits<char>_> *)
                                              auStack_168,0);
                bVar8 = absl::lts_20250127::ascii_isdigit(*puVar21);
                PVar3 = opts;
                local_1c8 = opts.use_annotation_frames;
                local_1d0._0_2_ =
                     opts.loc.
                     super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
                local_1d0._2_1_ = opts.checks_are_debug_only;
                local_1d0._3_1_ = opts.use_substitution_map;
                local_1d0._4_1_ = opts.use_curly_brace_substitutions;
                local_1d0._5_1_ = opts.allow_digit_substitutions;
                local_1d0._6_1_ = opts.strip_spaces_around_vars;
                local_1d0._7_1_ = opts.strip_raw_string_indentation;
                opts = PVar3;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_1e0,"expected digit after {");
                local_1e8 = local_1c8;
                idx = local_1d0;
                opts_08.use_annotation_frames = local_1c8;
                opts_08.loc.
                super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                _M_payload.
                super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                     (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                     (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                     (undefined2)local_1d0;
                opts_08.checks_are_debug_only = (bool)local_1d0._2_1_;
                opts_08.use_substitution_map = (bool)local_1d0._3_1_;
                opts_08.use_curly_brace_substitutions = (bool)local_1d0._4_1_;
                opts_08.allow_digit_substitutions = (bool)local_1d0._5_1_;
                opts_08.strip_spaces_around_vars = (bool)local_1d0._6_1_;
                opts_08.strip_raw_string_indentation = (bool)local_1d0._7_1_;
                bVar8 = Validate(bVar8,opts_08,local_1e0);
                if (bVar8) {
                  pvVar22 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                      ((basic_string_view<char,_std::char_traits<char>_> *)
                                       auStack_168,0);
                  cVar1 = *pvVar22;
                  local_1f8 = (long)(cVar1 + -0x31);
                  sVar11 = absl::lts_20250127::
                           Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::size((Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&this_local);
                  PVar3 = opts;
                  local_218.use_annotation_frames = opts.use_annotation_frames;
                  local_218.loc.
                  super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                  _M_payload.
                  super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                       opts.loc.
                       super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
                  local_218.checks_are_debug_only = opts.checks_are_debug_only;
                  local_218.use_substitution_map = opts.use_substitution_map;
                  local_218.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
                  local_218.allow_digit_substitutions = opts.allow_digit_substitutions;
                  local_218.strip_spaces_around_vars = opts.strip_spaces_around_vars;
                  local_218.strip_raw_string_indentation = opts.strip_raw_string_indentation;
                  in_R9._1_7_ = 0;
                  in_R9._M_payload._M_value._0_1_ = opts.use_annotation_frames;
                  opts = PVar3;
                  local_208._0_8_ = local_218._0_8_;
                  local_208.use_annotation_frames = local_218.use_annotation_frames;
                  bVar8 = ValidateIndexLookupInBounds
                                    (this,(long)(cVar1 + -0x31),sStack_c8,sVar11,PVar3);
                  if (bVar8) {
                    if (local_1f8 == sStack_c8) {
                      sStack_c8 = sStack_c8 + 1;
                    }
                    IndentIfAtStart(this);
                    local_260 = zc_sink_internal::ZeroCopyStreamByteSink::bytes_written
                                          (&this->sink_);
                    local_264 = 0;
                    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_int,_true>
                              (&local_258,&local_260,&local_264);
                    pbVar23 = absl::lts_20250127::
                              Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator[]((Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&this_local,local_1f8);
                    std::
                    pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::
                    pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              (&local_248,&local_258,pbVar23);
                    std::
                    vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::push_back((vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&annot_records.
                                    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_248);
                    std::
                    pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~pair(&local_248);
                  }
                }
              }
              goto LAB_00520db0;
            }
          }
          if (((unkuint9)opts & 0x100000000) != 0) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_278,"}")
            ;
            expected_00._M_str = pcVar30;
            expected_00._M_len = (size_t)local_278._M_str;
            bVar8 = absl::lts_20250127::ConsumePrefix
                              ((lts_20250127 *)auStack_168,
                               (Nonnull<absl::string_view_*>)local_278._M_len,expected_00);
            if (bVar8) {
              bVar8 = std::
                      vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::empty((vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&annot_records.
                                  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
              PVar3 = opts;
              local_288.use_annotation_frames = opts.use_annotation_frames;
              local_288.loc.
              super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
              _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>
                   = opts.loc.
                     super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
              local_288.checks_are_debug_only = opts.checks_are_debug_only;
              local_288.use_substitution_map = opts.use_substitution_map;
              local_288.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
              local_288.allow_digit_substitutions = opts.allow_digit_substitutions;
              local_288.strip_spaces_around_vars = opts.strip_spaces_around_vars;
              local_288.strip_raw_string_indentation = opts.strip_raw_string_indentation;
              opts = PVar3;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_298,"unexpected end of annotation");
              opts_07.use_annotation_frames = local_288.use_annotation_frames;
              opts_07.loc.
              super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
              _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>
                   = local_288.loc.
                     super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
              opts_07.checks_are_debug_only = local_288.checks_are_debug_only;
              opts_07.use_substitution_map = local_288.use_substitution_map;
              opts_07.use_curly_brace_substitutions = local_288.use_curly_brace_substitutions;
              opts_07.allow_digit_substitutions = local_288.allow_digit_substitutions;
              opts_07.strip_spaces_around_vars = local_288.strip_spaces_around_vars;
              opts_07.strip_raw_string_indentation = local_288.strip_raw_string_indentation;
              bVar8 = Validate(!bVar8,opts_07,local_298);
              if (bVar8) {
                sVar17 = zc_sink_internal::ZeroCopyStreamByteSink::bytes_written(&this->sink_);
                pvVar13 = std::
                          vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::back((vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&annot_records.
                                     super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
                (pvVar13->first).second = sVar17;
                if ((this->options_).annotation_collector != (AnnotationCollector *)0x0) {
                  pAVar2 = (this->options_).annotation_collector;
                  pvVar13 = std::
                            vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::back((vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&annot_records.
                                       super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  (*pAVar2->_vptr_AnnotationCollector[4])(pAVar2,pvVar13);
                }
                std::
                vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::pop_back((vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&annot_records.
                               super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
              }
              goto LAB_00520db0;
            }
          }
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&suffix._M_str);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_2c8);
          bVar4._M_str = (char *)suffix._M_len;
          bVar4._M_len = (size_t)auStack_2c8;
          bVar34 = local_328;
          if (((unkuint9)opts & 0x1000000000000) != 0) {
            local_2e8 = (lts_20250127 *)auStack_168;
            sStack_2e0 = var._M_len;
            str_01._M_str = extraout_RDX;
            str_01._M_len = var._M_len;
            sVar33 = absl::lts_20250127::StripLeadingAsciiWhitespace
                               ((lts_20250127 *)auStack_168,str_01);
            var._M_len = (size_t)sVar33._M_str;
            auStack_168 = (undefined1  [8])sVar33._M_len;
            local_2d8 = sVar33;
            sVar11 = std::basic_string_view<char,_std::char_traits<char>_>::size
                               ((basic_string_view<char,_std::char_traits<char>_> *)auStack_148);
            sVar14 = std::basic_string_view<char,_std::char_traits<char>_>::size
                               ((basic_string_view<char,_std::char_traits<char>_> *)auStack_168);
            bVar34 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               ((basic_string_view<char,_std::char_traits<char>_> *)auStack_148,0,
                                sVar11 - sVar14);
            prefix._M_len = (size_t)bVar34._M_str;
            suffix._M_str = (char *)bVar34._M_len;
            local_318 = (size_t)auStack_168;
            sStack_310 = var._M_len;
            str_00._M_str = (char *)var._M_len;
            str_00._M_len = (size_t)auStack_168;
            local_2f8 = bVar34;
            sVar33 = absl::lts_20250127::StripTrailingAsciiWhitespace(str_00);
            var._M_len = (size_t)sVar33._M_str;
            auStack_168 = (undefined1  [8])sVar33._M_len;
            local_308 = sVar33;
            sVar11 = std::basic_string_view<char,_std::char_traits<char>_>::size
                               ((basic_string_view<char,_std::char_traits<char>_> *)&suffix._M_str);
            sVar14 = std::basic_string_view<char,_std::char_traits<char>_>::size
                               ((basic_string_view<char,_std::char_traits<char>_> *)auStack_168);
            bVar34 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               ((basic_string_view<char,_std::char_traits<char>_> *)auStack_148,
                                sVar11 + sVar14,0xffffffffffffffff);
            bVar4 = bVar34;
          }
          suffix._M_len = (size_t)bVar4._M_str;
          auStack_2c8 = (undefined1  [8])bVar4._M_len;
          local_328 = bVar34;
          bVar8 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_168);
          PVar3 = opts;
          local_338.use_annotation_frames = opts.use_annotation_frames;
          local_338.loc.
          super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>._M_payload
          .super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
               opts.loc.
               super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
               _M_payload.
               super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
          local_338.checks_are_debug_only = opts.checks_are_debug_only;
          local_338.use_substitution_map = opts.use_substitution_map;
          local_338.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
          local_338.allow_digit_substitutions = opts.allow_digit_substitutions;
          local_338.strip_spaces_around_vars = opts.strip_spaces_around_vars;
          local_338.strip_raw_string_indentation = opts.strip_raw_string_indentation;
          opts = PVar3;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_348,"unexpected empty variable");
          local_350 = local_338.use_annotation_frames;
          oStack_358.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
          ._M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
               local_338.loc.
               super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
               _M_payload.
               super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
          bStack_356 = local_338.checks_are_debug_only;
          bStack_355 = local_338.use_substitution_map;
          bStack_354 = local_338.use_curly_brace_substitutions;
          bStack_353 = local_338.allow_digit_substitutions;
          bStack_352 = local_338.strip_spaces_around_vars;
          is_start = local_338.strip_raw_string_indentation;
          message._M_str = local_348._M_str;
          message._M_len = local_348._M_len;
          opts_06.use_annotation_frames = local_338.use_annotation_frames;
          opts_06.loc.
          super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>._M_payload
          .super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
               local_338.loc.
               super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
               _M_payload.
               super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
          opts_06.checks_are_debug_only = local_338.checks_are_debug_only;
          opts_06.use_substitution_map = local_338.use_substitution_map;
          opts_06.use_curly_brace_substitutions = local_338.use_curly_brace_substitutions;
          opts_06.allow_digit_substitutions = local_338.allow_digit_substitutions;
          opts_06.strip_spaces_around_vars = local_338.strip_spaces_around_vars;
          opts_06.strip_raw_string_indentation = local_338.strip_raw_string_indentation;
          pcVar30 = (char *)local_348._M_len;
          bVar8 = Validate(!bVar8,opts_06,message);
          if (bVar8) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_370,"_start$");
            expected_01._M_str = pcVar30;
            expected_01._M_len = (size_t)local_368;
            local_359 = absl::lts_20250127::ConsumePrefix
                                  ((lts_20250127 *)auStack_168,_auStack_370,expected_01);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_388,"_end$");
            expected_02._M_str = pcVar30;
            expected_02._M_len = (size_t)local_388._M_str;
            local_371 = absl::lts_20250127::ConsumePrefix
                                  ((lts_20250127 *)auStack_168,
                                   (Nonnull<absl::string_view_*>)local_388._M_len,expected_02);
            if ((((unkuint9)opts & 1) == 0) || (((local_359 & 1) == 0 && (!(bool)local_371)))) {
              std::optional<google::protobuf::io::Printer::ValueImpl<false>_>::optional
                        ((optional<google::protobuf::io::Printer::ValueImpl<false>_> *)
                         &same_name_record.
                          super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>
                          ._M_payload.
                          super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
                          .
                          super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                          ._M_engaged);
              std::optional<google::protobuf::io::Printer::AnnotationRecord>::optional
                        ((optional<google::protobuf::io::Printer::AnnotationRecord> *)local_5d8);
              if (((unkuint9)opts & 0x10000000000) == 0) {
LAB_00520366:
                local_698 = (_anonymous_namespace_ *)auStack_168;
                sStack_690 = var._M_len;
                local_6a8 = absl::lts_20250127::
                            MakeSpan<std::vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                      (&this->var_lookups_);
                var_02._M_str = (char *)local_6a8.ptr_;
                var_02._M_len = sStack_690;
                frames.len_._0_4_ = in_R9._M_payload;
                frames.len_._4_1_ = in_R9._M_engaged;
                frames.len_._5_3_ = in_R9._5_3_;
                frames.ptr_ = (pointer)local_6a8.len_;
                io::(anonymous_namespace)::
                LookupInFrameStack<google::protobuf::io::Printer::ValueImpl<false>>
                          (&local_688,local_698,var_02,frames);
                std::optional<google::protobuf::io::Printer::ValueImpl<false>_>::operator=
                          ((optional<google::protobuf::io::Printer::ValueImpl<false>_> *)
                           &same_name_record.
                            super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>
                            ._M_payload.
                            super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
                            .
                            super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                            ._M_engaged,&local_688);
                std::optional<google::protobuf::io::Printer::ValueImpl<false>_>::~optional
                          (&local_688);
                if (((unkuint9)opts & 1) != 0) {
                  local_708 = (_anonymous_namespace_ *)auStack_168;
                  pcStack_700 = (char *)var._M_len;
                  local_718 = absl::lts_20250127::
                              MakeSpan<std::vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                        (&this->annotation_lookups_);
                  var_00._M_str = pcStack_700;
                  var_00._M_len = (size_t)local_708;
                  anon_unknown_4::
                  LookupInFrameStack<google::protobuf::io::Printer::AnnotationRecord>
                            (&local_6f0,var_00,local_718);
                  std::optional<google::protobuf::io::Printer::AnnotationRecord>::operator=
                            ((optional<google::protobuf::io::Printer::AnnotationRecord> *)local_5d8,
                             &local_6f0);
                  std::optional<google::protobuf::io::Printer::AnnotationRecord>::~optional
                            (&local_6f0);
                }
LAB_00520465:
                bVar8 = std::optional<google::protobuf::io::Printer::ValueImpl<false>_>::has_value
                                  ((optional<google::protobuf::io::Printer::ValueImpl<false>_> *)
                                   &same_name_record.
                                    super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                                    ._M_engaged);
                PVar3 = opts;
                local_720 = opts.use_annotation_frames;
                local_728._0_2_ =
                     opts.loc.
                     super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
                local_728._2_1_ = opts.checks_are_debug_only;
                local_728._3_1_ = opts.use_substitution_map;
                local_728._4_1_ = opts.use_curly_brace_substitutions;
                local_728._5_1_ = opts.allow_digit_substitutions;
                local_728._6_1_ = opts.strip_spaces_around_vars;
                local_728._7_1_ = opts.strip_raw_string_indentation;
                local_748.var._M_len = (size_t)auStack_168;
                local_748.var._M_str = (char *)var._M_len;
                opts = PVar3;
                absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
                FunctionRef<google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__3,void>
                          ((FunctionRef<std::__cxx11::string()> *)&local_738,&local_748);
                local_750 = local_720;
                range_start = local_728;
                opts_02.use_annotation_frames = local_720;
                opts_02.loc.
                super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                _M_payload.
                super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                     (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                     (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                     (undefined2)local_728;
                opts_02.checks_are_debug_only = (bool)local_728._2_1_;
                opts_02.use_substitution_map = (bool)local_728._3_1_;
                opts_02.use_curly_brace_substitutions = (bool)local_728._4_1_;
                opts_02.allow_digit_substitutions = (bool)local_728._5_1_;
                opts_02.strip_spaces_around_vars = (bool)local_728._6_1_;
                opts_02.strip_raw_string_indentation = (bool)local_728._7_1_;
                bVar8 = Validate(bVar8,opts_02,local_738);
                if (((bVar8 ^ 0xffU) & 1) == 0) {
                  range_end = zc_sink_internal::ZeroCopyStreamByteSink::bytes_written(&this->sink_);
                  str = (string_view *)
                        zc_sink_internal::ZeroCopyStreamByteSink::bytes_written(&this->sink_);
                  pVVar24 = std::optional<google::protobuf::io::Printer::ValueImpl<false>_>::
                            operator->((optional<google::protobuf::io::Printer::ValueImpl<false>_> *
                                       )&same_name_record.
                                         super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>
                                         ._M_payload.
                                         super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
                                         .
                                         super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                                         ._M_engaged);
                  local_770 = ValueImpl<false>::AsString(pVVar24);
                  if (local_770 == (StringType *)0x0) {
                    pVVar24 = std::optional<google::protobuf::io::Printer::ValueImpl<false>_>::
                              operator->((optional<google::protobuf::io::Printer::ValueImpl<false>_>
                                          *)&same_name_record.
                                             super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>
                                             ._M_payload.
                                             super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
                                             .
                                             super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                                             ._M_engaged);
                    local_7b0 = ValueImpl<false>::AsCallback(pVVar24);
                    local_7c9 = 0;
                    if (local_7b0 == (Callback *)0x0) {
                      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                ((LogMessageFatal *)&local_7c8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.cc"
                                 ,0x2ea,"fnc != nullptr");
                      local_7c9 = 1;
                      pLVar26 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                                          (&local_7c8);
                      absl::lts_20250127::log_internal::Voidify::operator&&(&local_7b1,pLVar26);
                    }
                    if ((local_7c9 & 1) != 0) {
                      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                                ((LogMessageFatal *)&local_7c8);
                    }
                    bVar8 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                                      ((basic_string_view<char,_std::char_traits<char>_> *)
                                       &suffix._M_str);
                    local_ae9 = false;
                    if (bVar8) {
                      local_ae9 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                                            ((basic_string_view<char,_std::char_traits<char>_> *)
                                             auStack_2c8);
                    }
                    PVar3 = opts;
                    local_7d8.use_annotation_frames = opts.use_annotation_frames;
                    local_7d8.loc.
                    super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                    _M_payload.
                    super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                         opts.loc.
                         super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>
                    ;
                    local_7d8.checks_are_debug_only = opts.checks_are_debug_only;
                    local_7d8.use_substitution_map = opts.use_substitution_map;
                    local_7d8.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
                    local_7d8.allow_digit_substitutions = opts.allow_digit_substitutions;
                    local_7d8.strip_spaces_around_vars = opts.strip_spaces_around_vars;
                    local_7d8.strip_raw_string_indentation = opts.strip_raw_string_indentation;
                    opts = PVar3;
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (&local_7e8,
                               "substitution that resolves to callback cannot contain whitespace");
                    local_7f8.use_annotation_frames = local_7d8.use_annotation_frames;
                    local_7f8.loc.
                    super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                    _M_payload.
                    super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                         local_7d8.loc.
                         super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>
                    ;
                    local_7f8.checks_are_debug_only = local_7d8.checks_are_debug_only;
                    local_7f8.use_substitution_map = local_7d8.use_substitution_map;
                    local_7f8.use_curly_brace_substitutions =
                         local_7d8.use_curly_brace_substitutions;
                    local_7f8.allow_digit_substitutions = local_7d8.allow_digit_substitutions;
                    local_7f8.strip_spaces_around_vars = local_7d8.strip_spaces_around_vars;
                    local_7f8.strip_raw_string_indentation = local_7d8.strip_raw_string_indentation;
                    opts_01.use_annotation_frames = local_7d8.use_annotation_frames;
                    opts_01.loc.
                    super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                    _M_payload.
                    super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                         local_7d8.loc.
                         super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>
                    ;
                    opts_01.checks_are_debug_only = local_7d8.checks_are_debug_only;
                    opts_01.use_substitution_map = local_7d8.use_substitution_map;
                    opts_01.use_curly_brace_substitutions = local_7d8.use_curly_brace_substitutions;
                    opts_01.allow_digit_substitutions = local_7d8.allow_digit_substitutions;
                    opts_01.strip_spaces_around_vars = local_7d8.strip_spaces_around_vars;
                    opts_01.strip_raw_string_indentation = local_7d8.strip_raw_string_indentation;
                    Validate(local_ae9,opts_01,local_7e8);
                    range_end = zc_sink_internal::ZeroCopyStreamByteSink::bytes_written
                                          (&this->sink_);
                    local_811 = 0;
                    bVar8 = std::function<bool_()>::operator()(local_7b0);
                    if (((bVar8 ^ 0xffU) & 1) != 0) {
                      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                ((LogMessageFatal *)&local_810,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.cc"
                                 ,0x2f1,"(*fnc)()");
                      local_811 = 1;
                      pLVar26 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                                          (&local_810);
                      pLVar26 = absl::lts_20250127::log_internal::LogMessage::operator<<
                                          (pLVar26,(char (*) [46])
                                                   "recursive call encountered while evaluating \"")
                      ;
                      local_828 = (_anonymous_namespace_ *)auStack_168;
                      sStack_820 = var._M_len;
                      v._M_str = (char *)var._M_len;
                      v._M_len = (size_t)auStack_168;
                      pLVar26 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar26,v);
                      pLVar26 = absl::lts_20250127::log_internal::LogMessage::operator<<
                                          (pLVar26,(char (*) [2])0x7aa5cc);
                      absl::lts_20250127::log_internal::Voidify::operator&&(&local_7f9,pLVar26);
                    }
                    if ((local_811 & 1) != 0) {
                      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                                ((LogMessageFatal *)&local_810);
                    }
                    str = (string_view *)
                          zc_sink_internal::ZeroCopyStreamByteSink::bytes_written(&this->sink_);
                  }
                  else {
                    if ((this->at_start_of_line_ & 1U) != 0) {
                      bVar8 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                                        (local_770);
                      if (bVar8) {
                        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)&this->line_start_variables_,
                                   (basic_string_view<char,_std::char_traits<char>_> *)auStack_168);
                      }
                    }
                    bVar8 = std::basic_string_view<char,_std::char_traits<char>_>::empty(local_770);
                    if (!bVar8) {
                      local_788 = suffix._M_str;
                      sStack_780 = prefix._M_len;
                      data_01._M_str = (char *)prefix._M_len;
                      data_01._M_len = (size_t)suffix._M_str;
                      PrintRaw(this,data_01);
                      local_798 = local_770->_M_len;
                      pcStack_790 = local_770->_M_str;
                      data_03._M_len = local_770->_M_len;
                      data_03._M_str = local_770->_M_str;
                      PrintRaw(this,data_03);
                      psVar25 = (string_view *)
                                zc_sink_internal::ZeroCopyStreamByteSink::bytes_written
                                          (&this->sink_);
                      str = psVar25;
                      sVar11 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                         (local_770);
                      range_end = (long)psVar25 - sVar11;
                      fnc = (Callback *)auStack_2c8;
                      sStack_7a0 = suffix._M_len;
                      data_00._M_str = (char *)suffix._M_len;
                      data_00._M_len = (size_t)auStack_2c8;
                      PrintRaw(this,data_00);
                    }
                  }
                  if ((string_view *)range_end == str) {
                    pVVar24 = std::optional<google::protobuf::io::Printer::ValueImpl<false>_>::
                              operator->((optional<google::protobuf::io::Printer::ValueImpl<false>_>
                                          *)&same_name_record.
                                             super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>
                                             ._M_payload.
                                             super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
                                             .
                                             super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                                             ._M_engaged);
                    if ((pVVar24->consume_parens_if_empty & 1U) != 0) {
                      next_idx = this->paren_depth_ + 1;
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                                (&this->paren_depth_to_omit_,&next_idx);
                    }
                  }
                  text_1._M_str = (char *)(chunk._16_8_ + 1);
                  std::optional<google::protobuf::io::Printer::ValueImpl<false>_>::operator->
                            ((optional<google::protobuf::io::Printer::ValueImpl<false>_> *)
                             &same_name_record.
                              super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>
                              ._M_payload.
                              super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
                              .
                              super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                              ._M_engaged);
                  uVar15 = std::__cxx11::string::empty();
                  pcVar30 = text_1._M_str;
                  if ((uVar15 & 1) == 0) {
                    pcVar27 = (char *)std::
                                      vector<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                                      ::size(&pvStack_110->chunks);
                    if (pcVar30 < pcVar27) {
                      pvVar12 = std::
                                vector<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                                ::operator[](&pvStack_110->chunks,(size_type)text_1._M_str);
                      if ((pvVar12->is_var & 1U) == 0) {
                        chunk._16_8_ = text_1._M_str;
                        pvVar12 = std::
                                  vector<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                                  ::operator[](&pvStack_110->chunks,(size_type)text_1._M_str);
                        psVar31 = (string *)(pvVar12->text)._M_len;
                        text_1._M_len = (size_t)(pvVar12->text)._M_str;
                        __range5 = psVar31;
                        std::optional<google::protobuf::io::Printer::ValueImpl<false>_>::operator->
                                  ((optional<google::protobuf::io::Printer::ValueImpl<false>_> *)
                                   &same_name_record.
                                    super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                                    ._M_engaged);
                        __end5._M_current = (char *)std::__cxx11::string::begin();
                        _Stack_860._M_current = (char *)std::__cxx11::string::end();
                        while( true ) {
                          bVar8 = __gnu_cxx::operator!=(&__end5,&stack0xfffffffffffff7a0);
                          if (!bVar8) break;
                          pcVar28 = __gnu_cxx::
                                    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::operator*(&__end5);
                          local_861 = *pcVar28;
                          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                    (&local_878,&local_861,1);
                          expected_04._M_str = (char *)psVar31;
                          expected_04._M_len = (size_t)local_878._M_str;
                          bVar8 = absl::lts_20250127::ConsumePrefix
                                            ((lts_20250127 *)&__range5,
                                             (Nonnull<absl::string_view_*>)local_878._M_len,
                                             expected_04);
                          if (bVar8) break;
                          __gnu_cxx::
                          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator++(&__end5);
                        }
                        data._M_str = (char *)text_1._M_len;
                        data._M_len = (size_t)__range5;
                        PrintRaw(this,data);
                      }
                    }
                  }
                  bVar8 = std::optional<google::protobuf::io::Printer::AnnotationRecord>::has_value
                                    ((optional<google::protobuf::io::Printer::AnnotationRecord> *)
                                     local_5d8);
                  sVar17 = range_end;
                  psVar25 = str;
                  if ((bVar8) &&
                     ((this->options_).annotation_collector != (AnnotationCollector *)0x0)) {
                    pAVar2 = (this->options_).annotation_collector;
                    pAVar18 = std::optional<google::protobuf::io::Printer::AnnotationRecord>::
                              operator->((optional<google::protobuf::io::Printer::AnnotationRecord>
                                          *)local_5d8);
                    pAVar19 = std::optional<google::protobuf::io::Printer::AnnotationRecord>::
                              operator->((optional<google::protobuf::io::Printer::AnnotationRecord>
                                          *)local_5d8);
                    pAVar20 = std::optional<google::protobuf::io::Printer::AnnotationRecord>::
                              operator->((optional<google::protobuf::io::Printer::AnnotationRecord>
                                          *)local_5d8);
                    in_R9 = (pAVar20->semantic).
                            super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>
                    ;
                    insertion._16_8_ = in_R9;
                    (*pAVar2->_vptr_AnnotationCollector[3])
                              (pAVar2,sVar17,psVar25,&pAVar18->file_path,pAVar19);
                  }
                  if (((unkuint9)opts & 0x1000000) != 0) {
                    pVar35 = std::make_pair<unsigned_long&,unsigned_long&>
                                       (&range_end,(unsigned_long *)&str);
                    local_8b8 = pVar35;
                    absl::lts_20250127::container_internal::
                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                    ::
                    emplace<std::basic_string_view<char,_std::char_traits<char>_>_&,_std::pair<unsigned_long,_unsigned_long>,_0>
                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>::iterator,_bool>
                                *)local_8a8,
                               (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                                *)&this->substitutions_,
                               (basic_string_view<char,_std::char_traits<char>_> *)auStack_168,
                               &local_8b8);
                    if ((insertion.first.field_1._0_1_ & 1) == 0) {
                      local_8d0[1] = 1;
                      local_8d0[0] = 0;
                      std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                                (&local_8c8,local_8d0 + 1,local_8d0);
                      prVar29 = absl::lts_20250127::container_internal::
                                raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                                ::iterator::operator->((iterator *)local_8a8);
                      std::pair<unsigned_long,_unsigned_long>::operator=
                                (&prVar29->second,&local_8c8);
                    }
                  }
                }
              }
              else {
                puVar21 = (uchar *)std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                             ((basic_string_view<char,_std::char_traits<char>_> *)
                                              auStack_168,0);
                bVar8 = absl::lts_20250127::ascii_isdigit(*puVar21);
                if (!bVar8) goto LAB_00520366;
                sVar11 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                   ((basic_string_view<char,_std::char_traits<char>_> *)auStack_168)
                ;
                PVar3 = opts;
                local_5e0 = opts.use_annotation_frames;
                local_5e8._0_2_ =
                     opts.loc.
                     super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
                local_5e8._2_1_ = opts.checks_are_debug_only;
                local_5e8._3_1_ = opts.use_substitution_map;
                local_5e8._4_1_ = opts.use_curly_brace_substitutions;
                local_5e8._5_1_ = opts.allow_digit_substitutions;
                local_5e8._6_1_ = opts.strip_spaces_around_vars;
                local_5e8._7_1_ = opts.strip_raw_string_indentation;
                opts = PVar3;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_5f8,"expected single-digit variable");
                local_600 = local_5e0;
                idx_1 = local_5e8;
                opts_03.use_annotation_frames = local_5e0;
                opts_03.loc.
                super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                _M_payload.
                super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                     (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                     (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                     (undefined2)local_5e8;
                opts_03.checks_are_debug_only = (bool)local_5e8._2_1_;
                opts_03.use_substitution_map = (bool)local_5e8._3_1_;
                opts_03.use_curly_brace_substitutions = (bool)local_5e8._4_1_;
                opts_03.allow_digit_substitutions = (bool)local_5e8._5_1_;
                opts_03.strip_spaces_around_vars = (bool)local_5e8._6_1_;
                opts_03.strip_raw_string_indentation = (bool)local_5e8._7_1_;
                bVar8 = Validate(sVar11 == 1,opts_03,local_5f8);
                if (bVar8) {
                  pvVar22 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                      ((basic_string_view<char,_std::char_traits<char>_> *)
                                       auStack_168,0);
                  cVar1 = *pvVar22;
                  local_610 = (long)(cVar1 + -0x31);
                  sVar11 = absl::lts_20250127::
                           Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::size((Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&this_local);
                  PVar3 = opts;
                  local_630.use_annotation_frames = opts.use_annotation_frames;
                  local_630.loc.
                  super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                  _M_payload.
                  super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                       opts.loc.
                       super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
                  local_630.checks_are_debug_only = opts.checks_are_debug_only;
                  local_630.use_substitution_map = opts.use_substitution_map;
                  local_630.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
                  local_630.allow_digit_substitutions = opts.allow_digit_substitutions;
                  local_630.strip_spaces_around_vars = opts.strip_spaces_around_vars;
                  local_630.strip_raw_string_indentation = opts.strip_raw_string_indentation;
                  in_R9._1_7_ = 0;
                  in_R9._M_payload._M_value._0_1_ = opts.use_annotation_frames;
                  opts = PVar3;
                  local_620._0_8_ = local_630._0_8_;
                  local_620.use_annotation_frames = local_630.use_annotation_frames;
                  bVar8 = ValidateIndexLookupInBounds
                                    (this,(long)(cVar1 + -0x31),sStack_c8,sVar11,PVar3);
                  if (!bVar8) goto LAB_00520d88;
                  if (local_610 == sStack_c8) {
                    sStack_c8 = sStack_c8 + 1;
                  }
                  pbVar23 = absl::lts_20250127::
                            Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator[]((Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&this_local,local_610);
                  std::optional<google::protobuf::io::Printer::ValueImpl<false>>::operator=
                            ((optional<google::protobuf::io::Printer::ValueImpl<false>> *)
                             &same_name_record.
                              super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>
                              ._M_payload.
                              super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
                              .
                              super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                              ._M_engaged,pbVar23);
                  goto LAB_00520465;
                }
              }
LAB_00520d88:
              std::optional<google::protobuf::io::Printer::AnnotationRecord>::~optional
                        ((optional<google::protobuf::io::Printer::AnnotationRecord> *)local_5d8);
              std::optional<google::protobuf::io::Printer::ValueImpl<false>_>::~optional
                        ((optional<google::protobuf::io::Printer::ValueImpl<false>_> *)
                         &same_name_record.
                          super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>
                          ._M_payload.
                          super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
                          .
                          super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                          ._M_engaged);
            }
            else if ((local_359 & 1) == 0) {
              sVar11 = std::
                       vector<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                       ::size(&pvStack_110->chunks);
              if (sVar11 == 1) {
                bVar9 = true;
              }
              pvVar16 = std::
                        vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
                        ::back((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
                                *)&line_idx);
              record_var.first._M_str = (char *)pvVar16->second;
              sStack_3f8 = (pvVar16->first)._M_len;
              record_var.first._M_len = (size_t)(pvVar16->first)._M_str;
              std::
              vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
              ::pop_back((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
                          *)&line_idx);
              local_408 = sStack_3f8;
              sStack_400 = record_var.first._M_len;
              local_418 = (_anonymous_namespace_ *)auStack_168;
              sStack_410 = var._M_len;
              __x._M_str = (char *)record_var.first._M_len;
              __x._M_len = sStack_3f8;
              bVar34._M_str = (char *)var._M_len;
              bVar34._M_len = (size_t)auStack_168;
              bVar8 = std::operator==(__x,bVar34);
              PVar3 = opts;
              local_428.use_annotation_frames = opts.use_annotation_frames;
              local_428.loc.
              super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
              _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>
                   = opts.loc.
                     super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
              local_428.checks_are_debug_only = opts.checks_are_debug_only;
              local_428.use_substitution_map = opts.use_substitution_map;
              local_428.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
              local_428.allow_digit_substitutions = opts.allow_digit_substitutions;
              local_428.strip_spaces_around_vars = opts.strip_spaces_around_vars;
              local_428.strip_raw_string_indentation = opts.strip_raw_string_indentation;
              local_468.record_var.second = (unsigned_long)record_var.first._M_str;
              local_468.record_var.first._M_len = sStack_3f8;
              local_468.record_var.first._M_str = (char *)record_var.first._M_len;
              local_468.var._M_len = (size_t)auStack_168;
              local_468.var._M_str = (char *)var._M_len;
              opts = PVar3;
              absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
              FunctionRef<google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__1,void>
                        ((FunctionRef<std::__cxx11::string()> *)&local_438,&local_468);
              record.
              super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>.
              _M_payload.
              super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
              .super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>.
              _M_engaged = (bool)local_428.loc.
                                 super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>
                                 ._0_1_;
              record.
              super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>.
              _M_payload.
              super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
              .super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._65_1_
                   = local_428.loc.
                     super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>.
                     _M_engaged;
              record.
              super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>.
              _M_payload.
              super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
              .super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._66_1_
                   = local_428.checks_are_debug_only;
              record.
              super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>.
              _M_payload.
              super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
              .super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._67_1_
                   = local_428.use_substitution_map;
              record.
              super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>.
              _M_payload.
              super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
              .super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._68_1_
                   = local_428.use_curly_brace_substitutions;
              record.
              super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>.
              _M_payload.
              super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
              .super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._69_1_
                   = local_428.allow_digit_substitutions;
              record.
              super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>.
              _M_payload.
              super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
              .super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._70_1_
                   = local_428.strip_spaces_around_vars;
              record.
              super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>.
              _M_payload.
              super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
              .super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._71_1_
                   = local_428.strip_raw_string_indentation;
              opts_05.use_annotation_frames = local_428.use_annotation_frames;
              opts_05.loc.
              super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
              _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>
                   = local_428.loc.
                     super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
              opts_05.checks_are_debug_only = local_428.checks_are_debug_only;
              opts_05.use_substitution_map = local_428.use_substitution_map;
              opts_05.use_curly_brace_substitutions = local_428.use_curly_brace_substitutions;
              opts_05.allow_digit_substitutions = local_428.allow_digit_substitutions;
              opts_05.strip_spaces_around_vars = local_428.strip_spaces_around_vars;
              opts_05.strip_raw_string_indentation = local_428.strip_raw_string_indentation;
              bVar8 = Validate(bVar8,opts_05,local_438);
              if (((bVar8 ^ 0xffU) & 1) == 0) {
                local_4d8 = (_anonymous_namespace_ *)auStack_168;
                pcStack_4d0 = (char *)var._M_len;
                local_4e8 = absl::lts_20250127::
                            MakeSpan<std::vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                      (&this->annotation_lookups_);
                var_01._M_str = pcStack_4d0;
                var_01._M_len = (size_t)local_4d8;
                anon_unknown_4::LookupInFrameStack<google::protobuf::io::Printer::AnnotationRecord>
                          ((optional<google::protobuf::io::Printer::AnnotationRecord> *)local_4c0,
                           var_01,local_4e8);
                bVar8 = std::optional<google::protobuf::io::Printer::AnnotationRecord>::has_value
                                  ((optional<google::protobuf::io::Printer::AnnotationRecord> *)
                                   local_4c0);
                PVar3 = opts;
                local_4f8.use_annotation_frames = opts.use_annotation_frames;
                local_4f8.loc.
                super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                _M_payload.
                super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                     opts.loc.
                     super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
                local_4f8.checks_are_debug_only = opts.checks_are_debug_only;
                local_4f8.use_substitution_map = opts.use_substitution_map;
                local_4f8.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
                local_4f8.allow_digit_substitutions = opts.allow_digit_substitutions;
                local_4f8.strip_spaces_around_vars = opts.strip_spaces_around_vars;
                local_4f8.strip_raw_string_indentation = opts.strip_raw_string_indentation;
                local_518.var._M_len = (size_t)auStack_168;
                local_518.var._M_str = (char *)var._M_len;
                opts = PVar3;
                absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
                FunctionRef<google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__2,void>
                          ((FunctionRef<std::__cxx11::string()> *)&local_508,&local_518);
                opts_04.use_annotation_frames = local_4f8.use_annotation_frames;
                opts_04.loc.
                super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                _M_payload.
                super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                     local_4f8.loc.
                     super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
                opts_04.checks_are_debug_only = local_4f8.checks_are_debug_only;
                opts_04.use_substitution_map = local_4f8.use_substitution_map;
                opts_04.use_curly_brace_substitutions = local_4f8.use_curly_brace_substitutions;
                opts_04.allow_digit_substitutions = local_4f8.allow_digit_substitutions;
                opts_04.strip_spaces_around_vars = local_4f8.strip_spaces_around_vars;
                opts_04.strip_raw_string_indentation = local_4f8.strip_raw_string_indentation;
                bVar8 = Validate(bVar8,opts_04,local_508);
                pcVar30 = record_var.first._M_str;
                if ((((bVar8 ^ 0xffU) & 1) == 0) &&
                   ((this->options_).annotation_collector != (AnnotationCollector *)0x0)) {
                  pAVar2 = (this->options_).annotation_collector;
                  sVar17 = zc_sink_internal::ZeroCopyStreamByteSink::bytes_written(&this->sink_);
                  pAVar18 = std::optional<google::protobuf::io::Printer::AnnotationRecord>::
                            operator->((optional<google::protobuf::io::Printer::AnnotationRecord> *)
                                       local_4c0);
                  pAVar19 = std::optional<google::protobuf::io::Printer::AnnotationRecord>::
                            operator->((optional<google::protobuf::io::Printer::AnnotationRecord> *)
                                       local_4c0);
                  pAVar20 = std::optional<google::protobuf::io::Printer::AnnotationRecord>::
                            operator->((optional<google::protobuf::io::Printer::AnnotationRecord> *)
                                       local_4c0);
                  in_R9 = (pAVar20->semantic).
                          super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>
                  ;
                  (*pAVar2->_vptr_AnnotationCollector[3])
                            (pAVar2,pcVar30,sVar17,&pAVar18->file_path,pAVar19);
                }
                std::optional<google::protobuf::io::Printer::AnnotationRecord>::~optional
                          ((optional<google::protobuf::io::Printer::AnnotationRecord> *)local_4c0);
              }
            }
            else {
              IndentIfAtStart(this);
              text._M_str = (char *)zc_sink_internal::ZeroCopyStreamByteSink::bytes_written
                                              (&this->sink_);
              std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>::
              pair<std::basic_string_view<char,_std::char_traits<char>_>_&,_unsigned_long,_true>
                        (&local_3a0,(basic_string_view<char,_std::char_traits<char>_> *)auStack_168,
                         (unsigned_long *)&text._M_str);
              std::
              vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
              ::push_back((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
                           *)&line_idx,&local_3a0);
              uVar15 = chunk._16_8_ + 1;
              chunk._16_8_ = uVar15;
              sVar11 = std::
                       vector<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                       ::size(&pvStack_110->chunks);
              if (uVar15 < sVar11) {
                pvVar12 = std::
                          vector<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                          ::operator[](&pvStack_110->chunks,chunk._16_8_);
                pcVar30 = (char *)(pvVar12->text)._M_len;
                text._M_len = (size_t)(pvVar12->text)._M_str;
                pcStack_3b8 = pcVar30;
                do {
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (&local_3c8," ");
                  expected_03._M_str = pcVar30;
                  expected_03._M_len = (size_t)local_3c8._M_str;
                  bVar8 = absl::lts_20250127::ConsumePrefix
                                    ((lts_20250127 *)&pcStack_3b8,
                                     (Nonnull<absl::string_view_*>)local_3c8._M_len,expected_03);
                } while (bVar8);
                data_02._M_str = (char *)text._M_len;
                data_02._M_len = (size_t)pcStack_3b8;
                PrintRaw(this,data_02);
              }
            }
          }
        }
      }
LAB_00520db0:
      chunk._16_8_ = chunk._16_8_ + 1;
    }
    line = (value_type *)
           ((long)&(line->chunks).
                   super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1);
  } while( true );
}

Assistant:

void Printer::PrintImpl(absl::string_view format,
                        absl::Span<const std::string> args, PrintOptions opts) {
  // Inside of this function, we set indentation as we print new lines from
  // the format string. No matter how we exit this function, we should fix up
  // the indent to what it was before we entered; a cleanup makes it easy to
  // avoid this mistake.
  size_t original_indent = indent_;
  auto unindent =
      absl::MakeCleanup([this, original_indent] { indent_ = original_indent; });

  absl::string_view original = format;

  line_start_variables_.clear();

  if (opts.use_substitution_map) {
    substitutions_.clear();
  }

  auto fmt = TokenizeFormat(format, opts);
  PrintCodegenTrace(opts.loc);

  size_t arg_index = 0;
  bool skip_next_newline = false;
  std::vector<AnnotationCollector::Annotation> annot_stack;
  std::vector<std::pair<absl::string_view, size_t>> annot_records;
  for (size_t line_idx = 0; line_idx < fmt.lines.size(); ++line_idx) {
    const auto& line = fmt.lines[line_idx];

    // We only print a newline for lines that follow the first; a loop iteration
    // can also hint that we should not emit another newline through the
    // `skip_next_newline` variable.
    //
    // We also assume that double newlines are undesirable, so we
    // do not emit a newline if we are at the beginning of a line, *unless* the
    // previous format line is actually empty. This behavior is specific to
    // raw strings.
    if (line_idx > 0) {
      bool prev_was_empty = fmt.lines[line_idx - 1].chunks.empty();
      bool should_skip_newline =
          skip_next_newline ||
          (fmt.is_raw_string && (at_start_of_line_ && !prev_was_empty));
      if (!should_skip_newline) {
        line_start_variables_.clear();
        sink_.Write("\n");
        at_start_of_line_ = true;
      }
    }
    skip_next_newline = false;

    indent_ = original_indent + line.indent;

    for (size_t chunk_idx = 0; chunk_idx < line.chunks.size(); ++chunk_idx) {
      auto chunk = line.chunks[chunk_idx];

      if (!chunk.is_var) {
        PrintRaw(chunk.text);
        continue;
      }

      if (chunk.text.empty()) {
        // `$$` is an escape for just `$`.
        WriteRaw(&options_.variable_delimiter, 1);
        continue;
      }

      // If we get this far, we can conclude the chunk is a substitution
      // variable; we rename the `chunk` variable to make this clear below.
      absl::string_view var = chunk.text;
      if (substitution_listener_ != nullptr) {
        substitution_listener_(var, opts.loc.value_or(SourceLocation()));
      }
      if (opts.use_curly_brace_substitutions &&
          absl::ConsumePrefix(&var, "{")) {
        if (!Validate(var.size() == 1u, opts,
                      "expected single-digit variable")) {
          continue;
        }

        if (!Validate(absl::ascii_isdigit(var[0]), opts,
                      "expected digit after {")) {
          continue;
        }

        size_t idx = var[0] - '1';
        if (!ValidateIndexLookupInBounds(idx, arg_index, args.size(), opts)) {
          continue;
        }

        if (idx == arg_index) {
          ++arg_index;
        }

        IndentIfAtStart();
        annot_stack.push_back({{sink_.bytes_written(), 0}, args[idx]});
        continue;
      }

      if (opts.use_curly_brace_substitutions &&
          absl::ConsumePrefix(&var, "}")) {
        // The rest of var is actually ignored, and this is apparently
        // public API now. Oops?
        if (!Validate(!annot_stack.empty(), opts,
                      "unexpected end of annotation")) {
          continue;
        }

        annot_stack.back().first.second = sink_.bytes_written();
        if (options_.annotation_collector != nullptr) {
          options_.annotation_collector->AddAnnotationNew(annot_stack.back());
        }
        annot_stack.pop_back();
        continue;
      }

      absl::string_view prefix, suffix;
      if (opts.strip_spaces_around_vars) {
        var = absl::StripLeadingAsciiWhitespace(var);
        prefix = chunk.text.substr(0, chunk.text.size() - var.size());
        var = absl::StripTrailingAsciiWhitespace(var);
        suffix = chunk.text.substr(prefix.size() + var.size());
      }

      if (!Validate(!var.empty(), opts, "unexpected empty variable")) {
        continue;
      }

      bool is_start = absl::ConsumePrefix(&var, "_start$");
      bool is_end = absl::ConsumePrefix(&var, "_end$");
      if (opts.use_annotation_frames && (is_start || is_end)) {
        if (is_start) {
          IndentIfAtStart();
          annot_records.push_back({var, sink_.bytes_written()});

          // Skip all whitespace immediately after a _start.
          ++chunk_idx;
          if (chunk_idx < line.chunks.size()) {
            absl::string_view text = line.chunks[chunk_idx].text;
            while (absl::ConsumePrefix(&text, " ")) {
            }
            PrintRaw(text);
          }
        } else {
          // If a line consisted *only* of an _end, this will likely result in
          // a blank line if we do not zap the newline after it, so we do that
          // here.
          if (line.chunks.size() == 1) {
            skip_next_newline = true;
          }

          auto record_var = annot_records.back();
          annot_records.pop_back();

          if (!Validate(record_var.first == var, opts, [record_var, var] {
                return absl::StrFormat(
                    "_start and _end variables must match, but got %s and %s, "
                    "respectively",
                    record_var.first, var);
              })) {
            continue;
          }

          absl::optional<AnnotationRecord> record =
              LookupInFrameStack(var, absl::MakeSpan(annotation_lookups_));

          if (!Validate(record.has_value(), opts, [var] {
                return absl::StrCat("undefined annotation variable: \"",
                                    absl::CHexEscape(var), "\"");
              })) {
            continue;
          }

          if (options_.annotation_collector != nullptr) {
            options_.annotation_collector->AddAnnotation(
                record_var.second, sink_.bytes_written(), record->file_path,
                record->path, record->semantic);
          }
        }

        continue;
      }

      absl::optional<ValueView> sub;
      absl::optional<AnnotationRecord> same_name_record;
      if (opts.allow_digit_substitutions && absl::ascii_isdigit(var[0])) {
        if (!Validate(var.size() == 1u, opts,
                      "expected single-digit variable")) {
          continue;
        }

        size_t idx = var[0] - '1';
        if (!ValidateIndexLookupInBounds(idx, arg_index, args.size(), opts)) {
          continue;
        }
        if (idx == arg_index) {
          ++arg_index;
        }
        sub = args[idx];
      } else {
        sub = LookupInFrameStack(var, absl::MakeSpan(var_lookups_));

        if (opts.use_annotation_frames) {
          same_name_record =
              LookupInFrameStack(var, absl::MakeSpan(annotation_lookups_));
        }
      }

      // By returning here in case of empty we also skip possible spaces inside
      // the $...$, i.e. "void$ dllexpor$ f();" -> "void f();" in the empty
      // case.
      if (!Validate(sub.has_value(), opts, [var] {
            return absl::StrCat("undefined variable: \"", absl::CHexEscape(var),
                                "\"");
          })) {
        continue;
      }

      size_t range_start = sink_.bytes_written();
      size_t range_end = sink_.bytes_written();

      if (const absl::string_view* str = sub->AsString()) {
        if (at_start_of_line_ && str->empty()) {
          line_start_variables_.emplace_back(var);
        }

        if (!str->empty()) {
          // If `sub` is empty, we do not print the spaces around it.
          PrintRaw(prefix);
          PrintRaw(*str);
          range_end = sink_.bytes_written();
          range_start = range_end - str->size();
          PrintRaw(suffix);
        }
      } else {
        const ValueView::Callback* fnc = sub->AsCallback();
        ABSL_CHECK(fnc != nullptr);

        Validate(
            prefix.empty() && suffix.empty(), opts,
            "substitution that resolves to callback cannot contain whitespace");

        range_start = sink_.bytes_written();
        ABSL_CHECK((*fnc)())
            << "recursive call encountered while evaluating \"" << var << "\"";
        range_end = sink_.bytes_written();
      }

      if (range_start == range_end && sub->consume_parens_if_empty) {
        paren_depth_to_omit_.push_back(paren_depth_ + 1);
      }

      // If we just evaluated a value which specifies end-of-line consume-after
      // characters, and we're at the start of a line, that means we finished
      // with a newline.
      //
      // We trim a single end-of-line `consume_after` character in this case.
      //
      // This helps callback formatting "work as expected" with respect to forms
      // like
      //
      //   class Foo {
      //     $methods$;
      //   };
      //
      // Without this post-processing, it would turn into
      //
      //   class Foo {
      //     void Bar() {};
      //   };
      //
      // in many cases. Without the `;`, clang-format may format the template
      // incorrectly.
      auto next_idx = chunk_idx + 1;
      if (!sub->consume_after.empty() && next_idx < line.chunks.size() &&
          !line.chunks[next_idx].is_var) {
        chunk_idx = next_idx;

        absl::string_view text = line.chunks[chunk_idx].text;
        for (char c : sub->consume_after) {
          if (absl::ConsumePrefix(&text, absl::string_view(&c, 1))) {
            break;
          }
        }

        PrintRaw(text);
      }

      if (same_name_record.has_value() &&
          options_.annotation_collector != nullptr) {
        options_.annotation_collector->AddAnnotation(
            range_start, range_end, same_name_record->file_path,
            same_name_record->path, same_name_record->semantic);
      }

      if (opts.use_substitution_map) {
        auto insertion =
            substitutions_.emplace(var, std::make_pair(range_start, range_end));

        if (!insertion.second) {
          // This variable was used multiple times.
          // Make its span have negative length so
          // we can detect it if it gets used in an
          // annotation.
          insertion.first->second = {1, 0};
        }
      }
    }
  }

  Validate(arg_index == args.size(), opts,
           [original] { return absl::StrCat("unused args: ", original); });
  Validate(annot_stack.empty(), opts, [this, original] {
    return absl::StrFormat(
        "annotation range was not closed; expected %c}%c: %s",
        options_.variable_delimiter, options_.variable_delimiter, original);
  });

  // For multiline raw strings, we always make sure to end on a newline.
  if (fmt.is_raw_string && !at_start_of_line_) {
    PrintRaw("\n");
    at_start_of_line_ = true;
  }
}